

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O1

void gray_rgb_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                     JSAMPARRAY output_buf,int num_rows)

{
  JSAMPLE JVar1;
  uint uVar2;
  JSAMPROW pJVar3;
  bool bVar4;
  JSAMPROW pJVar5;
  ulong uVar6;
  
  if (0 < num_rows) {
    uVar2 = cinfo->output_width;
    do {
      if ((ulong)uVar2 != 0) {
        pJVar3 = (*input_buf)[input_row];
        pJVar5 = *output_buf + 2;
        uVar6 = 0;
        do {
          JVar1 = pJVar3[uVar6];
          *pJVar5 = JVar1;
          pJVar5[-1] = JVar1;
          pJVar5[-2] = JVar1;
          uVar6 = uVar6 + 1;
          pJVar5 = pJVar5 + 3;
        } while (uVar2 != uVar6);
      }
      input_row = input_row + 1;
      output_buf = output_buf + 1;
      bVar4 = 1 < num_rows;
      num_rows = num_rows + -1;
    } while (bVar4);
  }
  return;
}

Assistant:

METHODDEF(void)
gray_rgb_convert (j_decompress_ptr cinfo,
		  JSAMPIMAGE input_buf, JDIMENSION input_row,
		  JSAMPARRAY output_buf, int num_rows)
{
  register JSAMPROW inptr, outptr;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->output_width;

  while (--num_rows >= 0) {
    inptr = input_buf[0][input_row++];
    outptr = *output_buf++;
    for (col = 0; col < num_cols; col++) {
      /* We can dispense with GETJSAMPLE() here */
      outptr[RGB_RED] = outptr[RGB_GREEN] = outptr[RGB_BLUE] = inptr[col];
      outptr += RGB_PIXELSIZE;
    }
  }
}